

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiImageClearingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::api::anon_unknown_0::ClearAttachmentTestInstance::iterate
          (TestStatus *__return_storage_ptr__,ClearAttachmentTestInstance *this)

{
  uint uVar1;
  TestParams_conflict *pTVar2;
  DeviceInterface *pDVar3;
  bool bVar4;
  undefined8 uVar5;
  VkAccessFlags dstAccessMask;
  VkCommandBufferUsageFlags usageFlags;
  value_type *pvVar6;
  VkClearValue clearValue;
  allocator<char> local_99;
  vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_> clearRects;
  Vector<unsigned_int,_4> local_80;
  VkClearAttachment clearAttachment;
  VkClearRect rects [2];
  
  clearAttachment.aspectMask = (this->super_ImageClearingTestInstance).m_imageAspectFlags;
  clearAttachment.colorAttachment = 0;
  pTVar2 = (this->super_ImageClearingTestInstance).m_params;
  clearAttachment.clearValue.depthStencil = pTVar2->clearValue[0].depthStencil;
  clearAttachment.clearValue._8_8_ = *(undefined8 *)((long)pTVar2->clearValue + 8);
  tcu::Vector<unsigned_int,_4>::Vector(&local_80);
  clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (this->m_clearType == FULL_CLEAR) {
    pvVar6 = rects;
    rects[0].rect.offset.x = 0;
    rects[0].rect.offset.y = 0;
    pTVar2 = (this->super_ImageClearingTestInstance).m_params;
    rects[0].rect.extent.width = (pTVar2->imageExtent).width;
    rects[0].rect.extent.height = (pTVar2->imageExtent).height;
    rects[0].baseArrayLayer = 0;
    rects[0].layerCount = 1;
    std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::push_back(&clearRects,pvVar6);
    usageFlags = (VkCommandBufferUsageFlags)pvVar6;
  }
  else {
    pTVar2 = (this->super_ImageClearingTestInstance).m_params;
    uVar1 = (pTVar2->imageExtent).width;
    rects[1].rect.extent.height = (pTVar2->imageExtent).height;
    local_80.m_data[0] = uVar1 >> 2;
    local_80.m_data[1] = rects[1].rect.extent.height >> 2;
    rects[1].rect.extent.width = uVar1 >> 1;
    local_80.m_data[2] = local_80.m_data[0] + rects[1].rect.extent.width;
    local_80.m_data[3] = local_80.m_data[1] + (rects[1].rect.extent.height >> 1);
    rects[0].rect.offset = (VkOffset2D)((ulong)local_80.m_data[1] << 0x20);
    rects[0].rect.extent.height = rects[1].rect.extent.height >> 1;
    rects[0].rect.extent.width = (pTVar2->imageExtent).width;
    rects[0].baseArrayLayer = 0;
    rects[0].layerCount = 1;
    rects[1].rect.offset.y = 0;
    rects[1].baseArrayLayer = 0;
    rects[1].layerCount = 1;
    rects[1].rect.offset.x = local_80.m_data[0];
    std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::push_back(&clearRects,rects);
    pvVar6 = rects + 1;
    std::vector<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::push_back(&clearRects,pvVar6);
    usageFlags = (VkCommandBufferUsageFlags)pvVar6;
  }
  bVar4 = ::vk::isDepthStencilFormat
                    (((this->super_ImageClearingTestInstance).m_params)->imageFormat);
  dstAccessMask = 0x100;
  if (bVar4) {
    dstAccessMask = 0x400;
  }
  ImageClearingTestInstance::beginCommandBuffer(&this->super_ImageClearingTestInstance,usageFlags);
  uVar5 = 0;
  ImageClearingTestInstance::pipelineImageBarrier
            (&this->super_ImageClearingTestInstance,1,0x10000,0,dstAccessMask,
             VK_IMAGE_LAYOUT_UNDEFINED,bVar4 | VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);
  pTVar2 = (this->super_ImageClearingTestInstance).m_params;
  clearValue._8_8_ = uVar5;
  clearValue.depthStencil = (VkClearDepthStencilValue)*(undefined8 *)((long)&pTVar2->initValue + 8);
  ImageClearingTestInstance::beginRenderPass
            (&this->super_ImageClearingTestInstance,
             (VkSubpassContents)(pTVar2->initValue).depthStencil.depth,clearValue);
  pDVar3 = (this->super_ImageClearingTestInstance).m_vkd;
  (*pDVar3->_vptr_DeviceInterface[0x68])
            (pDVar3,(this->super_ImageClearingTestInstance).m_commandBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,1,&clearAttachment,
             ((long)clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>.
                   _M_impl.super__Vector_impl_data._M_start) / 0x18 & 0xffffffff);
  pDVar3 = (this->super_ImageClearingTestInstance).m_vkd;
  (*pDVar3->_vptr_DeviceInterface[0x76])
            (pDVar3,(this->super_ImageClearingTestInstance).m_commandBuffer.
                    super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  ImageClearingTestInstance::pipelineImageBarrier
            (&this->super_ImageClearingTestInstance,0x8000,0x1000,dstAccessMask,0x800,
             bVar4 | VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,VK_IMAGE_LAYOUT_GENERAL);
  ImageClearingTestInstance::endCommandBuffer(&this->super_ImageClearingTestInstance);
  ImageClearingTestInstance::submitCommandBuffer(&this->super_ImageClearingTestInstance);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)rects,"cmdClearAttachments passed",&local_99);
  ImageClearingTestInstance::verifyResultImage
            (__return_storage_ptr__,&this->super_ImageClearingTestInstance,(string *)rects,&local_80
            );
  std::__cxx11::string::~string((string *)rects);
  std::_Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>::~_Vector_base
            (&clearRects.super__Vector_base<vk::VkClearRect,_std::allocator<vk::VkClearRect>_>);
  return __return_storage_ptr__;
}

Assistant:

TestStatus iterate (void)
	{
		const VkClearAttachment clearAttachment =
		{
			m_imageAspectFlags,					// VkImageAspectFlags	aspectMask;
			0u,									// deUint32				colorAttachment;
			m_params.clearValue[0]				// VkClearValue			clearValue;
		};

		UVec4						clearCoords;
		std::vector<VkClearRect>	clearRects;

		if (m_clearType == FULL_CLEAR)
		{
			const VkClearRect rect =
			{
				{
					{ 0, 0 },																	// VkOffset2D    offset;
					{ m_params.imageExtent.width, m_params.imageExtent.height }					// VkExtent2D    extent;
				},																			// VkRect2D	rect;
				0u,																			// deUint32	baseArrayLayer;
				1u																			// deUint32	layerCount;
			};

			clearRects.push_back(rect);
		}
		else
		{
			const deUint32	clearX		= m_params.imageExtent.width  / 4u;
			const deUint32	clearY		= m_params.imageExtent.height / 4u;
			const deUint32	clearWidth	= m_params.imageExtent.width  / 2u;
			const deUint32	clearHeight	= m_params.imageExtent.height / 2u;

			clearCoords	= UVec4(clearX,					clearY,
								clearX + clearWidth,	clearY + clearHeight);

			const VkClearRect rects[2] =
			{
				{
					{
						{ 0,							static_cast<deInt32>(clearY)	},		// VkOffset2D    offset;
						{ m_params.imageExtent.width,	clearHeight						}		// VkExtent2D    extent;
					},																		// VkRect2D	rect;
					0u,																		// deUint32	baseArrayLayer;
					1u																		// deUint32	layerCount;
				},
				{
					{
						{ static_cast<deInt32>(clearX),	0							},			// VkOffset2D    offset;
						{ clearWidth,					m_params.imageExtent.height	}			// VkExtent2D    extent;
					},																		// VkRect2D	rect;
					0u,																		// deUint32	baseArrayLayer;
					1u																		// deUint32	layerCount;
				}
			};

			clearRects.push_back(rects[0]);
			clearRects.push_back(rects[1]);
		}

		const bool			isDepthStencil		= isDepthStencilFormat(m_params.imageFormat);
		const VkAccessFlags	accessMask			= (isDepthStencil ? VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT     : VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT);
		const VkImageLayout	attachmentLayout	= (isDepthStencil ? VK_IMAGE_LAYOUT_DEPTH_STENCIL_ATTACHMENT_OPTIMAL : VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL);

		beginCommandBuffer(0);

		pipelineImageBarrier(VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT,				// VkPipelineStageFlags		srcStageMask
							 VK_PIPELINE_STAGE_ALL_COMMANDS_BIT,			// VkPipelineStageFlags		dstStageMask
							 0,												// VkAccessFlags			srcAccessMask
							 accessMask,									// VkAccessFlags			dstAccessMask
							 VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
							 attachmentLayout);								// VkImageLayout			newLayout;

		beginRenderPass(VK_SUBPASS_CONTENTS_INLINE, m_params.initValue);
		m_vkd.cmdClearAttachments(*m_commandBuffer, 1, &clearAttachment, static_cast<deUint32>(clearRects.size()), &clearRects[0]);
		m_vkd.cmdEndRenderPass(*m_commandBuffer);

		pipelineImageBarrier(VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT,			// VkPipelineStageFlags		srcStageMask
							 VK_PIPELINE_STAGE_TRANSFER_BIT,				// VkPipelineStageFlags		dstStageMask
							 accessMask,									// VkAccessFlags			srcAccessMask
							 VK_ACCESS_TRANSFER_READ_BIT,					// VkAccessFlags			dstAccessMask
							 attachmentLayout,								// VkImageLayout			oldLayout;
							 VK_IMAGE_LAYOUT_GENERAL);						// VkImageLayout			newLayout;

		endCommandBuffer();
		submitCommandBuffer();

		return verifyResultImage("cmdClearAttachments passed", clearCoords);
	}